

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieanimation.cpp
# Opt level: O0

future<rlottie::Surface> __thiscall
AnimationImpl::renderAsync(AnimationImpl *this,size_t frameNo,Surface *surface,bool keepAspectRatio)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  shared_ptr<RenderTask> *in_RCX;
  shared_ptr<RenderTask> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  AnimationImpl *in_RSI;
  element_type *in_RDI;
  byte in_R8B;
  future<rlottie::Surface> fVar4;
  promise<rlottie::Surface> *in_stack_ffffffffffffff58;
  shared_ptr<RenderTask> *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  promise<rlottie::Surface> *in_stack_ffffffffffffff70;
  element_type *this_00;
  
  bVar1 = in_R8B & 1;
  this_00 = in_RDI;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RSI->mTask);
  if (bVar2) {
    std::promise<rlottie::Surface>::promise(in_stack_ffffffffffffff70);
    std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a2e7b
              );
    std::promise<rlottie::Surface>::operator=
              ((promise<rlottie::Surface> *)this_00,(promise<rlottie::Surface> *)in_RDI);
    std::promise<rlottie::Surface>::~promise(in_stack_ffffffffffffff70);
    std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a2ea0
              );
    std::promise<rlottie::Surface>::get_future(in_stack_ffffffffffffff58);
    std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1a2ebb
              );
    std::future<rlottie::Surface>::operator=
              ((future<rlottie::Surface> *)in_stack_ffffffffffffff70,
               (future<rlottie::Surface> *)
               CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
    std::future<rlottie::Surface>::~future((future<rlottie::Surface> *)0x1a2ed6);
  }
  else {
    std::make_shared<RenderTask>();
    std::shared_ptr<RenderTask>::operator=
              (in_stack_ffffffffffffff60,(shared_ptr<RenderTask> *)in_stack_ffffffffffffff58);
    std::shared_ptr<RenderTask>::~shared_ptr((shared_ptr<RenderTask> *)0x1a2e61);
  }
  peVar3 = std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1a2ee4);
  peVar3->playerImpl = in_RSI;
  peVar3 = std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1a2f02);
  peVar3->frameNo = (size_t)in_RDX;
  peVar3 = std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1a2f25);
  memcpy(&peVar3->surface,in_RCX,0x40);
  peVar3 = std::__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<RenderTask,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x1a2f54);
  peVar3->keepAspectRatio = (bool)(bVar1 & 1);
  RenderTaskScheduler::instance();
  std::shared_ptr<RenderTask>::shared_ptr(in_RCX,in_RDX);
  RenderTaskScheduler::process((RenderTaskScheduler *)in_RSI,(SharedRenderTask *)this_00);
  std::shared_ptr<RenderTask>::~shared_ptr((shared_ptr<RenderTask> *)0x1a2f99);
  fVar4.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  fVar4.super___basic_future<rlottie::Surface>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_00
  ;
  return (future<rlottie::Surface>)
         fVar4.super___basic_future<rlottie::Surface>._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::future<Surface> AnimationImpl::renderAsync(size_t    frameNo,
                                                Surface &&surface,
                                                bool      keepAspectRatio)
{
    if (!mTask) {
        mTask = std::make_shared<RenderTask>();
    } else {
        mTask->sender = std::promise<Surface>();
        mTask->receiver = mTask->sender.get_future();
    }
    mTask->playerImpl = this;
    mTask->frameNo = frameNo;
    mTask->surface = std::move(surface);
    mTask->keepAspectRatio = keepAspectRatio;

    return RenderTaskScheduler::instance().process(mTask);
}